

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

void __thiscall pbrt::Material::readFrom(Material *this,BinaryReader *binary)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  BinaryReader::read<std::__cxx11::string>(&local_30,binary);
  std::__cxx11::string::operator=((string *)&this->name,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void Material::readFrom(BinaryReader &binary) 
  {
    name = binary.read<std::string>();
    /*! \todo serialize materials (can only do once mateirals are fleshed out) */
  }